

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O3

SmallVector<llvm::StringRef,_2U> *
getNames(SmallVector<llvm::StringRef,_2U> *__return_storage_ptr__,DWARFDie *DIE,
        bool IncludeLinkageName)

{
  undefined8 *puVar1;
  void *__s1;
  SmallVector<llvm::StringRef,_2U> *__n;
  int iVar2;
  DWARFAbbreviationDeclaration *__s;
  SmallVector<llvm::StringRef,_2U> *pSVar3;
  undefined4 extraout_var;
  DWARFAbbreviationDeclaration *local_38;
  char *Str;
  
  (__return_storage_ptr__->super_SmallVectorImpl<llvm::StringRef>).
  super_SmallVectorTemplateBase<llvm::StringRef,_true>.
  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX =
       &__return_storage_ptr__->super_SmallVectorStorage<llvm::StringRef,_2U>;
  (__return_storage_ptr__->super_SmallVectorImpl<llvm::StringRef>).
  super_SmallVectorTemplateBase<llvm::StringRef,_true>.
  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size = 0;
  (__return_storage_ptr__->super_SmallVectorImpl<llvm::StringRef>).
  super_SmallVectorTemplateBase<llvm::StringRef,_true>.
  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Capacity = 2;
  local_38 = (DWARFAbbreviationDeclaration *)llvm::DWARFDie::getName(DIE,ShortName);
  if (local_38 == (DWARFAbbreviationDeclaration *)0x0) {
    __s = llvm::DWARFDie::getAbbreviationDeclarationPtr(DIE);
    if ((__s != (DWARFAbbreviationDeclaration *)0x0) && (__s->Tag == DW_TAG_namespace)) {
      __s = (DWARFAbbreviationDeclaration *)
            llvm::SmallVectorImpl<llvm::StringRef>::emplace_back<char_const(&)[22]>
                      (&__return_storage_ptr__->super_SmallVectorImpl<llvm::StringRef>,
                       (char (*) [22])"(anonymous namespace)");
    }
  }
  else {
    __s = (DWARFAbbreviationDeclaration *)
          llvm::SmallVectorImpl<llvm::StringRef>::emplace_back<char_const*&>
                    (&__return_storage_ptr__->super_SmallVectorImpl<llvm::StringRef>,
                     (char **)&local_38);
  }
  if ((IncludeLinkageName) &&
     (__s = (DWARFAbbreviationDeclaration *)llvm::DWARFDie::getName(DIE,LinkageName),
     __s != (DWARFAbbreviationDeclaration *)0x0)) {
    local_38 = __s;
    if ((__return_storage_ptr__->super_SmallVectorImpl<llvm::StringRef>).
        super_SmallVectorTemplateBase<llvm::StringRef,_true>.
        super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size != 0) {
      puVar1 = (undefined8 *)
               (__return_storage_ptr__->super_SmallVectorImpl<llvm::StringRef>).
               super_SmallVectorTemplateBase<llvm::StringRef,_true>.
               super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX;
      __s1 = (void *)*puVar1;
      __n = (SmallVector<llvm::StringRef,_2U> *)puVar1[1];
      pSVar3 = (SmallVector<llvm::StringRef,_2U> *)strlen((char *)__s);
      if (__n == pSVar3) {
        if (__n == (SmallVector<llvm::StringRef,_2U> *)0x0) {
          return pSVar3;
        }
        iVar2 = bcmp(__s1,__s,(size_t)__n);
        if (iVar2 == 0) {
          return (SmallVector<llvm::StringRef,_2U> *)CONCAT44(extraout_var,iVar2);
        }
      }
    }
    __s = (DWARFAbbreviationDeclaration *)
          llvm::SmallVectorImpl<llvm::StringRef>::emplace_back<char_const*&>
                    (&__return_storage_ptr__->super_SmallVectorImpl<llvm::StringRef>,
                     (char **)&local_38);
  }
  return (SmallVector<llvm::StringRef,_2U> *)__s;
}

Assistant:

static SmallVector<StringRef, 2> getNames(const DWARFDie &DIE,
                                          bool IncludeLinkageName = true) {
  SmallVector<StringRef, 2> Result;
  if (const char *Str = DIE.getName(DINameKind::ShortName))
    Result.emplace_back(Str);
  else if (DIE.getTag() == dwarf::DW_TAG_namespace)
    Result.emplace_back("(anonymous namespace)");

  if (IncludeLinkageName) {
    if (const char *Str = DIE.getName(DINameKind::LinkageName)) {
      if (Result.empty() || Result[0] != Str)
        Result.emplace_back(Str);
    }
  }

  return Result;
}